

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O1

void __thiscall YAML::Emitter::FlowSeqPrepareNode(Emitter *this,value child)

{
  ostream_wrapper *this_00;
  _Head_base<0UL,_YAML::EmitterState_*,_false> _Var1;
  size_t indent;
  size_t sVar2;
  size_t in_RCX;
  int __fd;
  bool requireSpace;
  undefined1 local_29;
  
  indent = EmitterState::LastIndent
                     ((this->m_pState)._M_t.
                      super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>
                      .super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl);
  _Var1._M_head_impl =
       (this->m_pState)._M_t.
       super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>._M_t.
       super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>.
       super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl;
  if ((((_Var1._M_head_impl)->m_hasAnchor == false) && ((_Var1._M_head_impl)->m_hasTag == false)) &&
     ((_Var1._M_head_impl)->m_hasNonContent == false)) {
    this_00 = &this->m_stream;
    if ((this->m_stream).m_comment == true) {
      ostream_wrapper::write(this_00,0x76ce52,(void *)0x1,in_RCX);
    }
    if ((this->m_stream).m_col < indent) {
      do {
        local_29 = 0x20;
        ostream_wrapper::write(this_00,(int)&local_29,(void *)0x1,in_RCX);
      } while ((this->m_stream).m_col < indent);
    }
    sVar2 = EmitterState::CurGroupChildCount
                      ((this->m_pState)._M_t.
                       super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>
                       .super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl);
    __fd = 0x76b95a;
    if (sVar2 == 0) {
      __fd = 0x75089a;
    }
    ostream_wrapper::write(this_00,__fd,(void *)0x1,in_RCX);
  }
  if ((child < BlockMap) && ((0x2eU >> (child & 0x1f) & 1) != 0)) {
    _Var1._M_head_impl =
         (this->m_pState)._M_t.
         super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>._M_t.
         super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>.
         super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl;
    requireSpace = true;
    if (((_Var1._M_head_impl)->m_hasAnchor == false) && (((_Var1._M_head_impl)->m_hasTag & 1U) == 0)
       ) {
      sVar2 = EmitterState::CurGroupChildCount(_Var1._M_head_impl);
      requireSpace = sVar2 != 0;
    }
    SpaceOrIndentTo(this,requireSpace,indent);
  }
  return;
}

Assistant:

void Emitter::FlowSeqPrepareNode(EmitterNodeType::value child) {
  const std::size_t lastIndent = m_pState->LastIndent();

  if (!m_pState->HasBegunNode()) {
    if (m_stream.comment())
      m_stream << "\n";
    m_stream << IndentTo(lastIndent);
    if (m_pState->CurGroupChildCount() == 0)
      m_stream << "[";
    else
      m_stream << ",";
  }

  switch (child) {
    case EmitterNodeType::NoType:
      break;
    case EmitterNodeType::Property:
    case EmitterNodeType::Scalar:
    case EmitterNodeType::FlowSeq:
    case EmitterNodeType::FlowMap:
      SpaceOrIndentTo(
          m_pState->HasBegunContent() || m_pState->CurGroupChildCount() > 0,
          lastIndent);
      break;
    case EmitterNodeType::BlockSeq:
    case EmitterNodeType::BlockMap:
      assert(false);
      break;
  }
}